

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O3

void __thiscall front::irGenerator::irGenerator::ir_begin_of_program(irGenerator *this)

{
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pcVar4;
  undefined8 uVar5;
  irGenerator *this_01;
  int iVar6;
  FunctionTy *pFVar7;
  PtrTy *pPVar8;
  Displayable this_02;
  element_type *peVar9;
  MirFunction *this_03;
  iterator iVar10;
  mapped_type *pmVar11;
  long *plVar12;
  long lVar13;
  undefined8 uVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  _Alloc_hider _Var16;
  Ty *__tmp;
  Ty *__tmp_11;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l_00;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l_01;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l_02;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l_03;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l_04;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l_05;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l_06;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l_07;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l_08;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l_09;
  string trueName;
  string funcName;
  allocator_type local_789;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_788;
  _func_int **local_780;
  undefined1 local_778 [16];
  undefined1 local_768 [16];
  IntTy *local_758;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_750;
  undefined1 local_748 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_738;
  irGenerator *local_728;
  _func_int **local_720;
  undefined1 local_718 [16];
  long *local_708;
  long local_700;
  long local_6f8 [2];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  *local_6e8;
  _func_int **local_6e0;
  PtrTy *local_6d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6d0;
  element_type *local_6c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6c0;
  element_type *local_6b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6b0;
  PtrTy *local_6a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6a0;
  element_type *local_698;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_690;
  element_type *local_688;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_680;
  element_type *local_678;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_670;
  PtrTy *local_668;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_660;
  PtrTy *local_658;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_650;
  element_type *local_648;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_640;
  PtrTy *local_638;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_630;
  PtrTy *local_628;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_620;
  element_type *local_618;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_610;
  element_type *local_608;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_600;
  element_type *local_5f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5f0;
  PtrTy *local_5e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5e0;
  SharedTyPtr local_5d8;
  SharedTyPtr local_5c8;
  SharedTyPtr local_5b8;
  SharedTyPtr local_5a8;
  SharedTyPtr local_598;
  SharedTyPtr local_588;
  SharedTyPtr local_578;
  SharedTyPtr local_568;
  SharedTyPtr local_558;
  SharedTyPtr local_548;
  SharedTyPtr local_538;
  SharedTyPtr local_528;
  SharedTyPtr local_518;
  shared_ptr<mir::inst::MirFunction> local_508;
  shared_ptr<mir::inst::MirFunction> local_4f8;
  shared_ptr<mir::inst::MirFunction> local_4e8;
  shared_ptr<mir::inst::MirFunction> local_4d8;
  SharedTyPtr local_4c8;
  SharedTyPtr local_4b8;
  SharedTyPtr local_4a8;
  SharedTyPtr local_498;
  SharedTyPtr local_488;
  SharedTyPtr local_478;
  SharedTyPtr local_468;
  string local_458;
  SharedTyPtr local_438;
  SharedTyPtr local_428;
  SharedTyPtr local_418;
  SharedTyPtr local_408;
  SharedTyPtr local_3f8;
  SharedTyPtr local_3e8;
  SharedTyPtr local_3d8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  shared_ptr<mir::types::FunctionTy> local_2c8;
  PtrTy *local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  long *local_230;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_228;
  long *local_220;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  undefined1 local_198 [16];
  pointer local_188;
  undefined1 local_178 [16];
  pointer local_168;
  string local_158;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  local_138;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  local_120;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  local_108;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  local_f0;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  local_d8;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  local_c0;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  local_a8;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  local_90;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  local_78;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  local_60;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  local_48;
  
  local_230 = DAT_001ef5a8;
  local_728 = this;
  if (externalFuncName_abi_cxx11_ != DAT_001ef5a8) {
    local_780 = (_func_int **)&PTR_display_001ecd58;
    local_6e0 = (_func_int **)&PTR_display_001ecf10;
    local_720 = (_func_int **)&PTR_display_001ecdb0;
    local_6e8 = &(this->_package).functions;
    plVar12 = externalFuncName_abi_cxx11_;
    do {
      local_708 = local_6f8;
      local_220 = plVar12;
      std::__cxx11::string::_M_construct<char*>((string *)&local_708,*plVar12,plVar12[1] + *plVar12)
      ;
      iVar6 = std::__cxx11::string::compare((char *)&local_708);
      if (iVar6 == 0) {
        pFVar7 = (FunctionTy *)operator_new(0x38);
        local_3d8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)operator_new(8);
        ((Displayable *)
        &((local_3d8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_780;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                  (&local_3d8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   (IntTy *)local_3d8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
        local_178 = (undefined1  [16])0x0;
        local_168 = (pointer)0x0;
        mir::types::FunctionTy::FunctionTy
                  (pFVar7,&local_3d8,
                   (vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                    *)local_178,true);
        local_778._0_8_ = pFVar7;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::FunctionTy*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_778 + 8),pFVar7);
        local_718._8_8_ = local_778._8_8_;
        local_718._0_8_ = local_778._0_8_;
        local_778._0_8_ = (element_type *)0x0;
        local_778._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::
        vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>::
        ~vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                 *)local_178);
        _Var15._M_pi = local_3d8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
LAB_0017fd44:
        if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
        }
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          pFVar7 = (FunctionTy *)operator_new(0x38);
          local_3e8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_3e8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_3e8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (IntTy *)local_3e8.
                              super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          local_198 = (undefined1  [16])0x0;
          local_188 = (pointer)0x0;
          mir::types::FunctionTy::FunctionTy
                    (pFVar7,&local_3e8,
                     (vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                      *)local_198,true);
          local_778._0_8_ = pFVar7;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::FunctionTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_778 + 8),pFVar7);
          local_718._8_8_ = local_778._8_8_;
          local_718._0_8_ = local_778._0_8_;
          local_778._0_8_ = (element_type *)0x0;
          local_778._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::~vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                     *)local_198);
          _Var15._M_pi = local_3e8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          goto LAB_0017fd44;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          pFVar7 = (FunctionTy *)operator_new(0x38);
          local_518.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_518.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_518.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (IntTy *)local_518.
                              super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          pPVar8 = (PtrTy *)operator_new(0x18);
          local_528.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_528.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_528.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (IntTy *)local_528.
                              super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          mir::types::PtrTy::PtrTy(pPVar8,&local_528);
          local_748._0_8_ = pPVar8;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::PtrTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_748 + 8),pPVar8);
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)local_748;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::vector(&local_48,__l_00,&local_789);
          mir::types::FunctionTy::FunctionTy(pFVar7,&local_518,&local_48,true);
          local_778._0_8_ = pFVar7;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::FunctionTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_778 + 8),pFVar7);
          local_718._8_8_ = local_778._8_8_;
          local_718._0_8_ = local_778._0_8_;
          local_778._0_8_ = (element_type *)0x0;
          local_778._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::~vector(&local_48);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_);
          }
          _Var15._M_pi = local_518.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_528.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_528.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var15._M_pi = local_518.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
          }
          goto LAB_0017fd44;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          pFVar7 = (FunctionTy *)operator_new(0x38);
          local_538.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_538.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_720;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::VoidTy*>
                    (&local_538.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (VoidTy *)
                     local_538.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    );
          peVar9 = (element_type *)operator_new(8);
          ((Displayable *)&(peVar9->super_Displayable)._vptr_Displayable)->_vptr_Displayable =
               local_780;
          local_748._0_8_ = peVar9;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_748 + 8),(IntTy *)peVar9);
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)local_748;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::vector(&local_60,__l_01,&local_789);
          mir::types::FunctionTy::FunctionTy(pFVar7,&local_538,&local_60,true);
          local_778._0_8_ = pFVar7;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::FunctionTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_778 + 8),pFVar7);
          local_718._8_8_ = local_778._8_8_;
          local_718._0_8_ = local_778._0_8_;
          local_778._0_8_ = (element_type *)0x0;
          local_778._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::~vector(&local_60);
          _Var15._M_pi = local_538.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_);
            _Var15._M_pi = local_538.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
          }
          goto LAB_0017fd44;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          pFVar7 = (FunctionTy *)operator_new(0x38);
          local_548.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_548.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_720;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::VoidTy*>
                    (&local_548.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (VoidTy *)
                     local_548.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    );
          peVar9 = (element_type *)operator_new(8);
          ((Displayable *)&(peVar9->super_Displayable)._vptr_Displayable)->_vptr_Displayable =
               local_780;
          local_748._0_8_ = peVar9;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_748 + 8),(IntTy *)peVar9);
          __l_02._M_len = 1;
          __l_02._M_array = (iterator)local_748;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::vector(&local_78,__l_02,&local_789);
          mir::types::FunctionTy::FunctionTy(pFVar7,&local_548,&local_78,true);
          local_778._0_8_ = pFVar7;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::FunctionTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_778 + 8),pFVar7);
          local_718._8_8_ = local_778._8_8_;
          local_718._0_8_ = local_778._0_8_;
          local_778._0_8_ = (element_type *)0x0;
          local_778._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::~vector(&local_78);
          _Var15._M_pi = local_548.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_);
            _Var15._M_pi = local_548.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
          }
          goto LAB_0017fd44;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          pFVar7 = (FunctionTy *)operator_new(0x38);
          local_3f8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_3f8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_720;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::VoidTy*>
                    (&local_3f8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (VoidTy *)
                     local_3f8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    );
          peVar9 = (element_type *)operator_new(8);
          ((Displayable *)&(peVar9->super_Displayable)._vptr_Displayable)->_vptr_Displayable =
               local_780;
          local_778._0_8_ = peVar9;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_778 + 8),(IntTy *)peVar9);
          this_02._vptr_Displayable = (_func_int **)operator_new(0x18);
          local_558.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_558.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_558.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (IntTy *)local_558.
                              super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          mir::types::PtrTy::PtrTy((PtrTy *)this_02._vptr_Displayable,&local_558);
          local_768._0_8_ = this_02._vptr_Displayable;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::PtrTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_768 + 8),
                     (PtrTy *)this_02._vptr_Displayable);
          __l_03._M_len = 2;
          __l_03._M_array = (iterator)local_778;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::vector(&local_90,__l_03,&local_789);
          mir::types::FunctionTy::FunctionTy(pFVar7,&local_3f8,&local_90,true);
          local_748._0_8_ = pFVar7;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::FunctionTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_748 + 8),pFVar7);
          local_718._8_8_ = local_748._8_8_;
          local_718._0_8_ = local_748._0_8_;
          local_748._0_8_ = (element_type *)0x0;
          local_748._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::~vector(&local_90);
          lVar13 = 0x20;
          do {
            if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_778 + lVar13 + -8) !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_778 + lVar13 + -8)
                        );
            }
            lVar13 = lVar13 + -0x10;
          } while (lVar13 != 0);
          _Var15._M_pi = local_3f8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_558.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_558.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var15._M_pi = local_3f8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
          }
          goto LAB_0017fd44;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          pFVar7 = (FunctionTy *)operator_new(0x38);
          local_568.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_568.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_720;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::VoidTy*>
                    (&local_568.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (VoidTy *)
                     local_568.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    );
          pPVar8 = (PtrTy *)operator_new(0x18);
          local_578.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_578.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_578.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (IntTy *)local_578.
                              super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          mir::types::PtrTy::PtrTy(pPVar8,&local_578);
          local_778._0_8_ = pPVar8;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::PtrTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_778 + 8),pPVar8);
          local_768._0_8_ = operator_new(8);
          *(_func_int ***)local_768._0_8_ = local_6e0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::RestParamTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_768 + 8),
                     (RestParamTy *)local_768._0_8_);
          __l_04._M_len = 2;
          __l_04._M_array = (iterator)local_778;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::vector(&local_a8,__l_04,&local_789);
          mir::types::FunctionTy::FunctionTy(pFVar7,&local_568,&local_a8,true);
          local_748._0_8_ = pFVar7;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::FunctionTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_748 + 8),pFVar7);
          local_718._8_8_ = local_748._8_8_;
          local_718._0_8_ = local_748._0_8_;
          local_748._0_8_ = (element_type *)0x0;
          local_748._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::~vector(&local_a8);
          lVar13 = 0x20;
          do {
            if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_778 + lVar13 + -8) !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_778 + lVar13 + -8)
                        );
            }
            lVar13 = lVar13 + -0x10;
          } while (lVar13 != 0);
          _Var15._M_pi = local_568.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_578.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_578.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var15._M_pi = local_568.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
          }
          goto LAB_0017fd44;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          pFVar7 = (FunctionTy *)operator_new(0x38);
          local_588.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_588.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_720;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::VoidTy*>
                    (&local_588.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (VoidTy *)
                     local_588.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    );
          peVar9 = (element_type *)operator_new(8);
          ((Displayable *)&(peVar9->super_Displayable)._vptr_Displayable)->_vptr_Displayable =
               local_780;
          local_748._0_8_ = peVar9;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_748 + 8),(IntTy *)peVar9);
          __l_05._M_len = 1;
          __l_05._M_array = (iterator)local_748;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::vector(&local_c0,__l_05,&local_789);
          mir::types::FunctionTy::FunctionTy(pFVar7,&local_588,&local_c0,true);
          local_778._0_8_ = pFVar7;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::FunctionTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_778 + 8),pFVar7);
          local_718._8_8_ = local_778._8_8_;
          local_718._0_8_ = local_778._0_8_;
          local_778._0_8_ = (element_type *)0x0;
          local_778._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::~vector(&local_c0);
          _Var15._M_pi = local_588.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_);
            _Var15._M_pi = local_588.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
          }
          goto LAB_0017fd44;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          pFVar7 = (FunctionTy *)operator_new(0x38);
          local_598.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_598.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_720;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::VoidTy*>
                    (&local_598.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (VoidTy *)
                     local_598.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    );
          peVar9 = (element_type *)operator_new(8);
          ((Displayable *)&(peVar9->super_Displayable)._vptr_Displayable)->_vptr_Displayable =
               local_780;
          local_748._0_8_ = peVar9;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_748 + 8),(IntTy *)peVar9);
          __l_06._M_len = 1;
          __l_06._M_array = (iterator)local_748;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::vector(&local_d8,__l_06,&local_789);
          mir::types::FunctionTy::FunctionTy(pFVar7,&local_598,&local_d8,true);
          local_778._0_8_ = pFVar7;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::FunctionTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_778 + 8),pFVar7);
          local_718._8_8_ = local_778._8_8_;
          local_718._0_8_ = local_778._0_8_;
          local_778._0_8_ = (element_type *)0x0;
          local_778._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::~vector(&local_d8);
          _Var15._M_pi = local_598.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_);
            _Var15._M_pi = local_598.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
          }
          goto LAB_0017fd44;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          pFVar7 = (FunctionTy *)operator_new(0x38);
          pPVar8 = (PtrTy *)operator_new(0x18);
          local_418.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_418.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_418.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (IntTy *)local_418.
                              super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          mir::types::PtrTy::PtrTy(pPVar8,&local_418);
          local_408.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)pPVar8;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::PtrTy*>
                    (&local_408.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,pPVar8);
          peVar9 = (element_type *)operator_new(8);
          ((Displayable *)&(peVar9->super_Displayable)._vptr_Displayable)->_vptr_Displayable =
               local_780;
          local_748._0_8_ = peVar9;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_748 + 8),(IntTy *)peVar9);
          __l_07._M_len = 1;
          __l_07._M_array = (iterator)local_748;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::vector(&local_f0,__l_07,&local_789);
          mir::types::FunctionTy::FunctionTy(pFVar7,&local_408,&local_f0,true);
          local_778._0_8_ = pFVar7;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::FunctionTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_778 + 8),pFVar7);
          local_718._8_8_ = local_778._8_8_;
          local_718._0_8_ = local_778._0_8_;
          local_778._0_8_ = (element_type *)0x0;
          local_778._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::~vector(&local_f0);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_);
          }
          _Var15._M_pi = local_418.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_408.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_408.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var15._M_pi = local_418.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
          }
          goto LAB_0017fd44;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          pFVar7 = (FunctionTy *)operator_new(0x38);
          pPVar8 = (PtrTy *)operator_new(0x18);
          local_438.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_438.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_438.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (IntTy *)local_438.
                              super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          mir::types::PtrTy::PtrTy(pPVar8,&local_438);
          local_428.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)pPVar8;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::PtrTy*>
                    (&local_428.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,pPVar8);
          peVar9 = (element_type *)operator_new(8);
          ((Displayable *)&(peVar9->super_Displayable)._vptr_Displayable)->_vptr_Displayable =
               local_780;
          local_778._0_8_ = peVar9;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_778 + 8),(IntTy *)peVar9);
          local_768._0_8_ = operator_new(8);
          *(_func_int ***)local_768._0_8_ = local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_768 + 8),
                     (IntTy *)local_768._0_8_);
          __l_08._M_len = 2;
          __l_08._M_array = (iterator)local_778;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::vector(&local_108,__l_08,&local_789);
          mir::types::FunctionTy::FunctionTy(pFVar7,&local_428,&local_108,true);
          local_748._0_8_ = pFVar7;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::FunctionTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_748 + 8),pFVar7);
          local_718._8_8_ = local_748._8_8_;
          local_718._0_8_ = local_748._0_8_;
          local_748._0_8_ = (element_type *)0x0;
          local_748._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::~vector(&local_108);
          lVar13 = 0x20;
          do {
            if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_778 + lVar13 + -8) !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_778 + lVar13 + -8)
                        );
            }
            lVar13 = lVar13 + -0x10;
          } while (lVar13 != 0);
          _Var15._M_pi = local_438.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_428.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_428.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var15._M_pi = local_438.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
          }
          goto LAB_0017fd44;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          pFVar7 = (FunctionTy *)operator_new(0x38);
          local_5a8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_5a8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_720;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::VoidTy*>
                    (&local_5a8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (VoidTy *)
                     local_5a8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    );
          pPVar8 = (PtrTy *)operator_new(0x18);
          local_5b8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_5b8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_5b8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (IntTy *)local_5b8.
                              super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          mir::types::PtrTy::PtrTy(pPVar8,&local_5b8);
          local_778._0_8_ = pPVar8;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::PtrTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_778 + 8),pPVar8);
          local_768._0_8_ = operator_new(8);
          *(_func_int ***)local_768._0_8_ = local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_768 + 8),
                     (IntTy *)local_768._0_8_);
          local_758 = (IntTy *)operator_new(8);
          (local_758->super_Ty).super_Displayable._vptr_Displayable = local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_750,local_758);
          __l_09._M_len = 3;
          __l_09._M_array = (iterator)local_778;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::vector(&local_120,__l_09,&local_789);
          mir::types::FunctionTy::FunctionTy(pFVar7,&local_5a8,&local_120,true);
          local_748._0_8_ = pFVar7;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::FunctionTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_748 + 8),pFVar7);
          local_718._8_8_ = local_748._8_8_;
          local_718._0_8_ = local_748._0_8_;
          local_748._0_8_ = (element_type *)0x0;
          local_748._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::~vector(&local_120);
          lVar13 = 0x30;
          do {
            if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_778 + lVar13 + -8) !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_778 + lVar13 + -8)
                        );
            }
            lVar13 = lVar13 + -0x10;
          } while (lVar13 != 0);
          _Var15._M_pi = local_5a8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_5b8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_5b8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var15._M_pi = local_5a8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
          }
          goto LAB_0017fd44;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        local_718 = (undefined1  [16])0x0;
        if (iVar6 == 0) {
          pFVar7 = (FunctionTy *)operator_new(0x38);
          local_5c8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_5c8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_720;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::VoidTy*>
                    (&local_5c8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (VoidTy *)
                     local_5c8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    );
          pPVar8 = (PtrTy *)operator_new(0x18);
          local_5d8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_5d8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_5d8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (IntTy *)local_5d8.
                              super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          mir::types::PtrTy::PtrTy(pPVar8,&local_5d8);
          local_748._0_8_ = pPVar8;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::PtrTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_748 + 8),pPVar8);
          __l._M_len = 1;
          __l._M_array = (iterator)local_748;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::vector(&local_138,__l,&local_789);
          mir::types::FunctionTy::FunctionTy(pFVar7,&local_5c8,&local_138,true);
          local_778._0_8_ = pFVar7;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::FunctionTy*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_778 + 8),pFVar7);
          local_718._8_8_ = local_778._8_8_;
          local_718._0_8_ = local_778._0_8_;
          local_778._0_8_ = (element_type *)0x0;
          local_778._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::~vector(&local_138);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_);
          }
          _Var15._M_pi = local_5c8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_5d8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_5d8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var15._M_pi = local_5c8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
          }
          goto LAB_0017fd44;
        }
      }
      this_03 = (MirFunction *)operator_new(0x98);
      local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_458,local_708,local_700 + (long)local_708);
      local_2c8.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_718._0_8_;
      local_2c8.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_718._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_718._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_718._8_8_ + 8) = *(_Atomic_word *)(local_718._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_718._8_8_ + 8) = *(_Atomic_word *)(local_718._8_8_ + 8) + 1;
        }
      }
      local_228 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_718._8_8_;
      mir::inst::MirFunction::MirFunction(this_03,&local_458,&local_2c8);
      local_778._0_8_ = this_03;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::MirFunction*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_778 + 8),this_03);
      uVar5 = local_778._0_8_;
      local_788 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_778._8_8_;
      local_778._0_8_ = (element_type *)0x0;
      local_778._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (local_2c8.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2c8.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
      }
      iVar6 = std::__cxx11::string::compare((char *)&local_708);
      if (iVar6 == 0) {
        pPVar8 = (PtrTy *)operator_new(0x18);
        local_468.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)operator_new(8);
        ((Displayable *)
        &((local_468.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_780;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                  (&local_468.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   (IntTy *)local_468.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
        mir::types::PtrTy::PtrTy(pPVar8,&local_468);
        local_5e8 = pPVar8;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::PtrTy*>
                  (&local_5e0,pPVar8);
        _Var15._M_pi = local_5e0._M_pi;
        pPVar8 = local_5e8;
        if (local_5e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_5e0._M_pi)->_M_use_count = (local_5e0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_5e0._M_pi)->_M_use_count = (local_5e0._M_pi)->_M_use_count + 1;
          }
        }
        local_778._0_4_ = 1;
        pmVar11 = std::
                  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                  ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                *)(uVar5 + 0x38),(key_type_conflict *)local_778);
        (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &pPVar8->super_Ty;
        p_Var3 = (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Var15._M_pi;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        local_238 = (ulong)((uint)local_238 & 0xff000000) + 1;
        *(long *)&pmVar11->is_memory_var = local_238;
        _Var15._M_pi = local_468.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
        if (local_5e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5e0._M_pi);
          _Var15._M_pi = local_468.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
        }
joined_r0x00180db8:
        if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
        }
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          local_5f8 = (element_type *)operator_new(8);
          ((Displayable *)&(local_5f8->super_Displayable)._vptr_Displayable)->_vptr_Displayable =
               local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_5f0,(IntTy *)local_5f8);
          _Var15._M_pi = local_5f0._M_pi;
          peVar9 = local_5f8;
          if (local_5f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_5f0._M_pi)->_M_use_count = (local_5f0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_5f0._M_pi)->_M_use_count = (local_5f0._M_pi)->_M_use_count + 1;
            }
          }
          local_778._0_4_ = 1;
          pmVar11 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  *)(uVar5 + 0x38),(key_type_conflict *)local_778);
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               peVar9;
          p_Var3 = (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Var15._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          local_240 = (ulong)((uint)local_240 & 0xff000000) + 1;
          *(long *)&pmVar11->is_memory_var = local_240;
          _Var15._M_pi = local_5f0._M_pi;
          goto joined_r0x00180db8;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          local_608 = (element_type *)operator_new(8);
          ((Displayable *)&(local_608->super_Displayable)._vptr_Displayable)->_vptr_Displayable =
               local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_600,(IntTy *)local_608);
          _Var15._M_pi = local_600._M_pi;
          peVar9 = local_608;
          if (local_600._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_600._M_pi)->_M_use_count = (local_600._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_600._M_pi)->_M_use_count = (local_600._M_pi)->_M_use_count + 1;
            }
          }
          local_778._0_4_ = 1;
          pmVar11 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  *)(uVar5 + 0x38),(key_type_conflict *)local_778);
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               peVar9;
          p_Var3 = (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Var15._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          local_248 = (ulong)((uint)local_248 & 0xff000000) + 1;
          *(long *)&pmVar11->is_memory_var = local_248;
          _Var15._M_pi = local_600._M_pi;
          goto joined_r0x00180db8;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          local_618 = (element_type *)operator_new(8);
          ((Displayable *)&(local_618->super_Displayable)._vptr_Displayable)->_vptr_Displayable =
               local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_610,(IntTy *)local_618);
          _Var15._M_pi = local_610._M_pi;
          peVar9 = local_618;
          if (local_610._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_610._M_pi)->_M_use_count = (local_610._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_610._M_pi)->_M_use_count = (local_610._M_pi)->_M_use_count + 1;
            }
          }
          local_778._0_4_ = 1;
          pmVar11 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  *)(uVar5 + 0x38),(key_type_conflict *)local_778);
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               peVar9;
          p_Var3 = (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Var15._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          local_250 = (ulong)((uint)local_250 & 0xff000000) + 1;
          *(long *)&pmVar11->is_memory_var = local_250;
          if (local_610._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_610._M_pi);
          }
          pPVar8 = (PtrTy *)operator_new(0x18);
          local_478.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_478.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_478.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (IntTy *)local_478.
                              super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          mir::types::PtrTy::PtrTy(pPVar8,&local_478);
          local_628 = pPVar8;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::PtrTy*>
                    (&local_620,pPVar8);
          _Var15._M_pi = local_620._M_pi;
          pPVar8 = local_628;
          if (local_620._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_620._M_pi)->_M_use_count = (local_620._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_620._M_pi)->_M_use_count = (local_620._M_pi)->_M_use_count + 1;
            }
          }
          local_778._0_4_ = 2;
          pmVar11 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  *)(uVar5 + 0x38),(key_type_conflict *)local_778);
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &pPVar8->super_Ty;
          p_Var3 = (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Var15._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          local_258 = (ulong)((uint)local_258 & 0xff000000) + 1;
          *(long *)&pmVar11->is_memory_var = local_258;
          _Var15._M_pi = local_478.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_620._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_620._M_pi);
            _Var15._M_pi = local_478.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
          }
          goto joined_r0x00180db8;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          pPVar8 = (PtrTy *)operator_new(0x18);
          local_488.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_488.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_488.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (IntTy *)local_488.
                              super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          mir::types::PtrTy::PtrTy(pPVar8,&local_488);
          local_638 = pPVar8;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::PtrTy*>
                    (&local_630,pPVar8);
          _Var15._M_pi = local_630._M_pi;
          pPVar8 = local_638;
          if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_630._M_pi)->_M_use_count = (local_630._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_630._M_pi)->_M_use_count = (local_630._M_pi)->_M_use_count + 1;
            }
          }
          local_778._0_4_ = 1;
          pmVar11 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  *)(uVar5 + 0x38),(key_type_conflict *)local_778);
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &pPVar8->super_Ty;
          p_Var3 = (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Var15._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          lVar13 = (ulong)((uint)local_260 & 0xff000000) + 1;
          *(long *)&pmVar11->is_memory_var = lVar13;
          if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
          }
          if (local_488.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_488.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          local_260 = lVar13;
          local_648 = (element_type *)operator_new(8);
          ((Displayable *)&(local_648->super_Displayable)._vptr_Displayable)->_vptr_Displayable =
               local_6e0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::RestParamTy*>
                    (&local_640,(RestParamTy *)local_648);
          _Var15._M_pi = local_640._M_pi;
          peVar9 = local_648;
          if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_640._M_pi)->_M_use_count = (local_640._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_640._M_pi)->_M_use_count = (local_640._M_pi)->_M_use_count + 1;
            }
          }
          local_778._0_4_ = 2;
          pmVar11 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  *)(uVar5 + 0x38),(key_type_conflict *)local_778);
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               peVar9;
          p_Var3 = (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Var15._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          local_268 = (ulong)((uint)local_268 & 0xff000000) + 1;
          *(long *)&pmVar11->is_memory_var = local_268;
          _Var15._M_pi = local_640._M_pi;
          goto joined_r0x00180db8;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          pPVar8 = (PtrTy *)operator_new(0x18);
          local_498.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_498.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_498.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (IntTy *)local_498.
                              super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          mir::types::PtrTy::PtrTy(pPVar8,&local_498);
          local_658 = pPVar8;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::PtrTy*>
                    (&local_650,pPVar8);
          _Var15._M_pi = local_650._M_pi;
          pPVar8 = local_658;
          if (local_650._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_650._M_pi)->_M_use_count = (local_650._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_650._M_pi)->_M_use_count = (local_650._M_pi)->_M_use_count + 1;
            }
          }
          local_778._0_4_ = 1;
          pmVar11 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  *)(uVar5 + 0x38),(key_type_conflict *)local_778);
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &pPVar8->super_Ty;
          p_Var3 = (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Var15._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          local_270 = (ulong)((uint)local_270 & 0xff000000) + 1;
          *(long *)&pmVar11->is_memory_var = local_270;
          _Var15._M_pi = local_498.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_650._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_650._M_pi);
            _Var15._M_pi = local_498.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
          }
          goto joined_r0x00180db8;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          pPVar8 = (PtrTy *)operator_new(0x18);
          local_4a8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_4a8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_4a8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (IntTy *)local_4a8.
                              super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          mir::types::PtrTy::PtrTy(pPVar8,&local_4a8);
          local_668 = pPVar8;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::PtrTy*>
                    (&local_660,pPVar8);
          _Var15._M_pi = local_660._M_pi;
          pPVar8 = local_668;
          if (local_660._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_660._M_pi)->_M_use_count = (local_660._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_660._M_pi)->_M_use_count = (local_660._M_pi)->_M_use_count + 1;
            }
          }
          local_778._0_4_ = 1;
          pmVar11 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  *)(uVar5 + 0x38),(key_type_conflict *)local_778);
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &pPVar8->super_Ty;
          p_Var3 = (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Var15._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          local_278 = (ulong)((uint)local_278 & 0xff000000) + 1;
          *(long *)&pmVar11->is_memory_var = local_278;
          _Var15._M_pi = local_4a8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_660._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_660._M_pi);
            _Var15._M_pi = local_4a8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
          }
          goto joined_r0x00180db8;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          local_678 = (element_type *)operator_new(8);
          ((Displayable *)&(local_678->super_Displayable)._vptr_Displayable)->_vptr_Displayable =
               local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_670,(IntTy *)local_678);
          _Var15._M_pi = local_670._M_pi;
          peVar9 = local_678;
          if (local_670._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_670._M_pi)->_M_use_count = (local_670._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_670._M_pi)->_M_use_count = (local_670._M_pi)->_M_use_count + 1;
            }
          }
          local_778._0_4_ = 1;
          pmVar11 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  *)(uVar5 + 0x38),(key_type_conflict *)local_778);
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               peVar9;
          p_Var3 = (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Var15._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          local_280 = (ulong)((uint)local_280 & 0xff000000) + 1;
          *(long *)&pmVar11->is_memory_var = local_280;
          _Var15._M_pi = local_670._M_pi;
          goto joined_r0x00180db8;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          local_688 = (element_type *)operator_new(8);
          ((Displayable *)&(local_688->super_Displayable)._vptr_Displayable)->_vptr_Displayable =
               local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_680,(IntTy *)local_688);
          _Var15._M_pi = local_680._M_pi;
          peVar9 = local_688;
          if (local_680._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_680._M_pi)->_M_use_count = (local_680._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_680._M_pi)->_M_use_count = (local_680._M_pi)->_M_use_count + 1;
            }
          }
          local_778._0_4_ = 1;
          pmVar11 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  *)(uVar5 + 0x38),(key_type_conflict *)local_778);
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               peVar9;
          p_Var3 = (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Var15._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          lVar13 = (ulong)((uint)local_288 & 0xff000000) + 1;
          *(long *)&pmVar11->is_memory_var = lVar13;
          if (local_680._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_680._M_pi);
          }
          local_288 = lVar13;
          local_698 = (element_type *)operator_new(8);
          ((Displayable *)&(local_698->super_Displayable)._vptr_Displayable)->_vptr_Displayable =
               local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_690,(IntTy *)local_698);
          _Var15._M_pi = local_690._M_pi;
          peVar9 = local_698;
          if (local_690._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_690._M_pi)->_M_use_count = (local_690._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_690._M_pi)->_M_use_count = (local_690._M_pi)->_M_use_count + 1;
            }
          }
          local_778._0_4_ = 2;
          pmVar11 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  *)(uVar5 + 0x38),(key_type_conflict *)local_778);
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               peVar9;
          p_Var3 = (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Var15._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          local_290 = (ulong)((uint)local_290 & 0xff000000) + 1;
          *(long *)&pmVar11->is_memory_var = local_290;
          _Var15._M_pi = local_690._M_pi;
          goto joined_r0x00180db8;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          pPVar8 = (PtrTy *)operator_new(0x18);
          local_2b8 = pPVar8;
          local_4b8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_4b8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_4b8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (IntTy *)local_4b8.
                              super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          mir::types::PtrTy::PtrTy(pPVar8,&local_4b8);
          local_6a8 = pPVar8;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::PtrTy*>
                    (&local_6a0,pPVar8);
          _Var15._M_pi = local_6a0._M_pi;
          pPVar8 = local_6a8;
          if (local_6a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_6a0._M_pi)->_M_use_count = (local_6a0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_6a0._M_pi)->_M_use_count = (local_6a0._M_pi)->_M_use_count + 1;
            }
          }
          this_00 = (map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                     *)(uVar5 + 0x38);
          local_778._0_4_ = 1;
          pmVar11 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::operator[](this_00,(key_type_conflict *)local_778);
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &pPVar8->super_Ty;
          p_Var3 = (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Var15._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          lVar13 = (ulong)((uint)local_298 & 0xff000000) + 1;
          *(long *)&pmVar11->is_memory_var = lVar13;
          if (local_6a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6a0._M_pi);
          }
          if (local_4b8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_4b8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          local_298 = lVar13;
          local_6b8 = (element_type *)operator_new(8);
          ((Displayable *)&(local_6b8->super_Displayable)._vptr_Displayable)->_vptr_Displayable =
               local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_6b0,(IntTy *)local_6b8);
          _Var15._M_pi = local_6b0._M_pi;
          peVar9 = local_6b8;
          if (local_6b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_6b0._M_pi)->_M_use_count = (local_6b0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_6b0._M_pi)->_M_use_count = (local_6b0._M_pi)->_M_use_count + 1;
            }
          }
          local_778._0_4_ = 2;
          pmVar11 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::operator[](this_00,(key_type_conflict *)local_778);
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               peVar9;
          p_Var3 = (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Var15._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          lVar13 = (ulong)((uint)local_2a0 & 0xff000000) + 1;
          *(long *)&pmVar11->is_memory_var = lVar13;
          if (local_6b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6b0._M_pi);
          }
          local_2a0 = lVar13;
          local_6c8 = (element_type *)operator_new(8);
          ((Displayable *)&(local_6c8->super_Displayable)._vptr_Displayable)->_vptr_Displayable =
               local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_6c0,(IntTy *)local_6c8);
          _Var15._M_pi = local_6c0._M_pi;
          peVar9 = local_6c8;
          if (local_6c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_6c0._M_pi)->_M_use_count = (local_6c0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_6c0._M_pi)->_M_use_count = (local_6c0._M_pi)->_M_use_count + 1;
            }
          }
          local_778._0_4_ = 3;
          pmVar11 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::operator[](this_00,(key_type_conflict *)local_778);
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               peVar9;
          p_Var3 = (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Var15._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          local_2a8 = (ulong)((uint)local_2a8 & 0xff000000) + 1;
          *(long *)&pmVar11->is_memory_var = local_2a8;
          _Var15._M_pi = local_6c0._M_pi;
          goto joined_r0x00180db8;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          pPVar8 = (PtrTy *)operator_new(0x18);
          local_4c8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(8);
          ((Displayable *)
          &((local_4c8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_Displayable)._vptr_Displayable)->_vptr_Displayable = local_780;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                    (&local_4c8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (IntTy *)local_4c8.
                              super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          mir::types::PtrTy::PtrTy(pPVar8,&local_4c8);
          local_6d8 = pPVar8;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::PtrTy*>
                    (&local_6d0,pPVar8);
          _Var15._M_pi = local_6d0._M_pi;
          pPVar8 = local_6d8;
          if (local_6d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_6d0._M_pi)->_M_use_count = (local_6d0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_6d0._M_pi)->_M_use_count = (local_6d0._M_pi)->_M_use_count + 1;
            }
          }
          local_778._0_4_ = 1;
          pmVar11 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  *)(uVar5 + 0x38),(key_type_conflict *)local_778);
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &pPVar8->super_Ty;
          p_Var3 = (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (pmVar11->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Var15._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          local_2b0 = (ulong)((uint)local_2b0 & 0xff000000) + 1;
          *(long *)&pmVar11->is_memory_var = local_2b0;
          _Var15._M_pi = local_4c8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_6d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6d0._M_pi);
            _Var15._M_pi = local_4c8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
          }
          goto joined_r0x00180db8;
        }
      }
      iVar6 = std::__cxx11::string::compare((char *)&local_708);
      if (iVar6 == 0) {
        local_778._0_8_ = (element_type *)local_768;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_778,"printf","");
        std::__cxx11::string::_M_assign((string *)(uVar5 + 8));
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e8,local_778._0_8_,
                   (pointer)(local_778._0_8_ + (long)(_func_int ***)local_778._8_8_));
        getFunctionName(&local_1b8,local_728,&local_2e8);
        local_4d8.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)uVar5;
        local_4d8.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = local_788;
        if (local_788 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_788->_M_use_count = local_788->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_788->_M_use_count = local_788->_M_use_count + 1;
          }
        }
        insertFunc(local_728,&local_1b8,&local_4d8);
        if (local_4d8.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4d8.
                     super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_308,local_778._0_8_,
                   (pointer)(local_778._0_8_ + (long)(_func_int ***)local_778._8_8_));
        getFunctionName((string *)local_748,local_728,&local_308);
        iVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                 ::find(&local_6e8->_M_t,(string *)local_748);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
        ::operator=((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                     *)&iVar10._M_node[3]._M_right,
                    (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                     *)(uVar5 + 0x38));
        if ((element_type *)local_748._0_8_ != (element_type *)(local_748 + 0x10)) {
          operator_delete((void *)local_748._0_8_,local_738._M_allocated_capacity + 1);
        }
        uVar14 = local_308.field_2._M_allocated_capacity;
        _Var16._M_p = local_308._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
LAB_001809a1:
          operator_delete(_Var16._M_p,uVar14 + 1);
        }
LAB_001809a9:
        if ((element_type *)local_778._0_8_ != (element_type *)local_768) {
          operator_delete((void *)local_778._0_8_,(ulong)(local_768._0_8_ + 1));
        }
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          local_778._0_8_ = (element_type *)local_768;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_778,"_sysy_starttime","");
          std::__cxx11::string::_M_assign((string *)(uVar5 + 8));
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_328,local_778._0_8_,
                     (pointer)(local_778._0_8_ + (long)(_func_int ***)local_778._8_8_));
          getFunctionName(&local_1d8,local_728,&local_328);
          local_4e8.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)uVar5;
          local_4e8.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = local_788;
          if (local_788 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_788->_M_use_count = local_788->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_788->_M_use_count = local_788->_M_use_count + 1;
            }
          }
          insertFunc(local_728,&local_1d8,&local_4e8);
          if (local_4e8.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_4e8.
                       super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
          }
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_348,local_778._0_8_,
                     (pointer)(local_778._0_8_ + (long)(_func_int ***)local_778._8_8_));
          getFunctionName((string *)local_748,local_728,&local_348);
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                   ::find(&local_6e8->_M_t,(string *)local_748);
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
          ::operator=((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                       *)&iVar10._M_node[3]._M_right,
                      (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                       *)(uVar5 + 0x38));
          if ((element_type *)local_748._0_8_ != (element_type *)(local_748 + 0x10)) {
            operator_delete((void *)local_748._0_8_,local_738._M_allocated_capacity + 1);
          }
          uVar14 = local_348.field_2._M_allocated_capacity;
          _Var16._M_p = local_348._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) goto LAB_001809a1;
          goto LAB_001809a9;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_708);
        if (iVar6 == 0) {
          local_778._0_8_ = (element_type *)local_768;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_778,"_sysy_stoptime","");
          std::__cxx11::string::_M_assign((string *)(uVar5 + 8));
          local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_368,local_778._0_8_,
                     (pointer)(local_778._0_8_ + (long)(_func_int ***)local_778._8_8_));
          getFunctionName(&local_1f8,local_728,&local_368);
          local_4f8.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)uVar5;
          local_4f8.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = local_788;
          if (local_788 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_788->_M_use_count = local_788->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_788->_M_use_count = local_788->_M_use_count + 1;
            }
          }
          insertFunc(local_728,&local_1f8,&local_4f8);
          if (local_4f8.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_4f8.
                       super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
          }
          local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_388,local_778._0_8_,
                     (pointer)(local_778._0_8_ + (long)(_func_int ***)local_778._8_8_));
          getFunctionName((string *)local_748,local_728,&local_388);
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                   ::find(&local_6e8->_M_t,(string *)local_748);
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
          ::operator=((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                       *)&iVar10._M_node[3]._M_right,
                      (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                       *)(uVar5 + 0x38));
          if ((element_type *)local_748._0_8_ != (element_type *)(local_748 + 0x10)) {
            operator_delete((void *)local_748._0_8_,local_738._M_allocated_capacity + 1);
          }
          uVar14 = local_388.field_2._M_allocated_capacity;
          _Var16._M_p = local_388._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388._M_dataplus._M_p != &local_388.field_2) goto LAB_001809a1;
          goto LAB_001809a9;
        }
      }
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3a8,local_708,local_700 + (long)local_708);
      getFunctionName(&local_218,local_728,&local_3a8);
      local_508.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar5;
      local_508.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_788;
      if (local_788 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_788->_M_use_count = local_788->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_788->_M_use_count = local_788->_M_use_count + 1;
        }
      }
      insertFunc(local_728,&local_218,&local_508);
      if (local_508.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_508.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3c8,local_708,local_700 + (long)local_708);
      getFunctionName((string *)local_778,local_728,&local_3c8);
      iVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
               ::find(&local_6e8->_M_t,(string *)local_778);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
      ::operator=((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                   *)&iVar10._M_node[3]._M_right,
                  (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                   *)(uVar5 + 0x38));
      if ((element_type *)local_778._0_8_ != (element_type *)local_768) {
        operator_delete((void *)local_778._0_8_,(ulong)(local_768._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
      if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228);
      }
      if (local_788 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_788);
      }
      if (local_708 != local_6f8) {
        operator_delete(local_708,local_6f8[0] + 1);
      }
      plVar12 = local_220 + 4;
    } while (plVar12 != local_230);
  }
  this_01 = local_728;
  uVar1 = local_728->_InitStringId;
  uVar2 = local_728->_InitLabelId;
  local_728->_nowLabelId = uVar2;
  local_728->_nowStringId = uVar1;
  pcVar4 = (local_728->_GlobalInitFuncName)._M_dataplus._M_p;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_158,pcVar4,pcVar4 + (local_728->_GlobalInitFuncName)._M_string_length)
  ;
  ir_declare_function(this_01,&local_158,INT);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void irGenerator::ir_begin_of_program() {
  for (string funcName : externalFuncName) {
    shared_ptr<mir::inst::MirFunction> func;
    shared_ptr<FunctionTy> type;

    if (funcName == "getint") {
      type = shared_ptr<FunctionTy>(
          new FunctionTy(SharedTyPtr(new IntTy()), {}, true));
    } else if (funcName == "getch") {
      type = shared_ptr<FunctionTy>(
          new FunctionTy(SharedTyPtr(new IntTy()), {}, true));
    } else if (funcName == "getarray") {
      type = shared_ptr<FunctionTy>(new FunctionTy(
          SharedTyPtr(new IntTy()),
          {SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy())))}, true));
    } else if (funcName == "putint") {
      type = shared_ptr<FunctionTy>(new FunctionTy(
          SharedTyPtr(new VoidTy()), {SharedTyPtr(new IntTy())}, true));
    } else if (funcName == "putch") {
      type = shared_ptr<FunctionTy>(new FunctionTy(
          SharedTyPtr(new VoidTy()), {SharedTyPtr(new IntTy())}, true));
    } else if (funcName == "putarray") {
      type = shared_ptr<FunctionTy>(
          new FunctionTy(SharedTyPtr(new VoidTy()),
                         {SharedTyPtr(new IntTy()),
                          SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy)))},
                         true));
    } else if (funcName == "putf") {
      type = shared_ptr<FunctionTy>(
          new FunctionTy(SharedTyPtr(new VoidTy()),
                         {SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy))),
                          SharedTyPtr(new RestParamTy())},
                         true));
    } else if (funcName == "starttime") {
      type = shared_ptr<FunctionTy>(new FunctionTy(
          SharedTyPtr(new VoidTy()), {SharedTyPtr(new IntTy())}, true));
    } else if (funcName == "stoptime") {
      type = shared_ptr<FunctionTy>(new FunctionTy(
          SharedTyPtr(new VoidTy()), {SharedTyPtr(new IntTy())}, true));
    } else if (funcName == "malloc") {
      type = shared_ptr<FunctionTy>(
          new FunctionTy(SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy))),
                         {SharedTyPtr(new IntTy())}, true));
    } else if (funcName == "calloc") {
      type = shared_ptr<FunctionTy>(new FunctionTy(
          SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy))),
          {SharedTyPtr(new IntTy()), SharedTyPtr(new IntTy())}, true));
    } else if (funcName == "memset") {
      type = shared_ptr<FunctionTy>(
          new FunctionTy(SharedTyPtr(new VoidTy()),
                         {SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy()))),
                          SharedTyPtr(new IntTy()), SharedTyPtr(new IntTy())},
                         true));
    } else if (funcName == "free") {
      type = shared_ptr<FunctionTy>(new FunctionTy(
          SharedTyPtr(new VoidTy()),
          {SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy)))}, true));
    }

    func = shared_ptr<mir::inst::MirFunction>(
        new mir::inst::MirFunction(funcName, type));

    if (funcName == "getarray") {
      func->variables[1] = Variable(
          SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy()))), true, false);
    } else if (funcName == "putint") {
      func->variables[1] = Variable(SharedTyPtr(new IntTy()), true, false);
    } else if (funcName == "putch") {
      func->variables[1] = Variable(SharedTyPtr(new IntTy()), true, false);
    } else if (funcName == "putarray") {
      func->variables[1] = Variable(SharedTyPtr(new IntTy()), true, false);
      func->variables[2] =
          Variable(SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy))), true, false);
    } else if (funcName == "putf") {
      func->variables[1] =
          Variable(SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy))), true, false);
      func->variables[2] =
          Variable(SharedTyPtr(new RestParamTy()), true, false);
    } else if (funcName == "starttime") {
      func->variables[1] = Variable(
          SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy()))), true, false);
    } else if (funcName == "stoptime") {
      func->variables[1] = Variable(
          SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy()))), true, false);
    } else if (funcName == "malloc") {
      func->variables[1] = Variable(SharedTyPtr(new IntTy()), true, false);
    } else if (funcName == "calloc") {
      func->variables[1] = Variable(SharedTyPtr(new IntTy()), true, false);
      func->variables[2] = Variable(SharedTyPtr(new IntTy()), true, false);
    } else if (funcName == "memset") {
      func->variables[1] = Variable(
          SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy()))), true, false);
      func->variables[2] = Variable(SharedTyPtr(new IntTy()), true, false);
      func->variables[3] = Variable(SharedTyPtr(new IntTy()), true, false);
    } else if (funcName == "free") {
      func->variables[1] =
          Variable(SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy))), true, false);
    }

    if (funcName == "putf") {
      string trueName = "printf";
      func->name = trueName;
      insertFunc(getFunctionName(trueName), func);
      _package.functions.find(getFunctionName(trueName))->second.variables =
          func->variables;
    } else if (funcName == "starttime") {
      string trueName = "_sysy_starttime";
      func->name = trueName;
      insertFunc(getFunctionName(trueName), func);
      _package.functions.find(getFunctionName(trueName))->second.variables =
          func->variables;
    } else if (funcName == "stoptime") {
      string trueName = "_sysy_stoptime";
      func->name = trueName;
      insertFunc(getFunctionName(trueName), func);
      _package.functions.find(getFunctionName(trueName))->second.variables =
          func->variables;
    }

    insertFunc(getFunctionName(funcName), func);
    _package.functions.find(getFunctionName(funcName))->second.variables =
        func->variables;
  }

  _nowLabelId = _InitLabelId;
  _nowStringId = _InitStringId;

  ir_declare_function(_GlobalInitFuncName, symbol::SymbolKind::INT);
}